

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

int tnt_schema_add_space(mh_assoc_t *schema,char **data)

{
  uint64_t uVar1;
  char *__src;
  char *pcVar2;
  mh_assoc_t *pmVar3;
  char *name_tmp;
  byte *pbStack_50;
  uint32_t tuple_len;
  char *tuple;
  assoc_val *space_number;
  assoc_val *space_string;
  tnt_schema_sval *space;
  char **data_local;
  mh_assoc_t *schema_local;
  char **ppcStack_18;
  uint8_t c;
  uint local_c;
  
  space_string = (assoc_val *)0x0;
  space_number = (assoc_val *)0x0;
  tuple = (char *)0x0;
  pbStack_50 = (byte *)*data;
  schema_local._6_1_ = *pbStack_50;
  space = (tnt_schema_sval *)data;
  data_local = (char **)schema;
  if (mp_type_hint[schema_local._6_1_] == MP_ARRAY) {
    ppcStack_18 = (char **)&stack0xffffffffffffffb0;
    schema_local._7_1_ = mp_load_u8(ppcStack_18);
    if ((schema_local._7_1_ & 0x40) == 0) {
      local_c = schema_local._7_1_ & 0xf;
    }
    else {
      local_c = mp_decode_array_slowpath(schema_local._7_1_,ppcStack_18);
    }
    space_string = (assoc_val *)tnt_mem_alloc(0x18);
    if (space_string != (assoc_val *)0x0) {
      memset(space_string,0,0x18);
      schema_local._5_1_ = *pbStack_50;
      if (mp_type_hint[schema_local._5_1_] == MP_UINT) {
        uVar1 = mp_decode_uint((char **)&stack0xffffffffffffffb0);
        *(int *)&(space_string->key).field_0xc = (int)uVar1;
        mp_next((char **)&stack0xffffffffffffffb0);
        schema_local._4_1_ = *pbStack_50;
        if (mp_type_hint[schema_local._4_1_] == MP_STR) {
          __src = mp_decode_str((char **)&stack0xffffffffffffffb0,&(space_string->key).id_len);
          pcVar2 = (char *)tnt_mem_alloc((ulong)(space_string->key).id_len);
          (space_string->key).id = pcVar2;
          if ((space_string->key).id != (char *)0x0) {
            memcpy((space_string->key).id,__src,(ulong)(space_string->key).id_len);
            pmVar3 = mh_assoc_new();
            space_string->data = pmVar3;
            if ((space_string->data != (void *)0x0) &&
               (space_number = (assoc_val *)tnt_mem_alloc(0x18), space_number != (assoc_val *)0x0))
            {
              (space_number->key).id = (space_string->key).id;
              (space_number->key).id_len = (space_string->key).id_len;
              space_number->data = space_string;
              tuple = (char *)tnt_mem_alloc(0x18);
              if ((long *)tuple != (long *)0x0) {
                *(undefined1 **)tuple = &(space_string->key).field_0xc;
                *(undefined4 *)((long)tuple + 8) = 4;
                *(assoc_val **)((long)tuple + 0x10) = space_string;
                mh_assoc_put((mh_assoc_t *)data_local,&space_number,(assoc_val ***)0x0,(void *)0x0);
                mh_assoc_put((mh_assoc_t *)data_local,(assoc_val **)&tuple,(assoc_val ***)0x0,
                             (void *)0x0);
                mp_next(&space->name);
                return 0;
              }
              tuple = (char *)0x0;
            }
          }
        }
      }
    }
  }
  mp_next(&space->name);
  tnt_schema_sval_free((tnt_schema_sval *)space_string);
  if (space_number != (assoc_val *)0x0) {
    tnt_mem_free(space_number);
  }
  if (tuple != (char *)0x0) {
    tnt_mem_free(tuple);
  }
  return -1;
}

Assistant:

static inline int
tnt_schema_add_space(struct mh_assoc_t *schema, const char **data)
{
	struct tnt_schema_sval *space = NULL;
	struct assoc_val *space_string = NULL, *space_number = NULL;
	const char *tuple = *data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		goto error;
	uint32_t tuple_len = mp_decode_array(&tuple); (void )tuple_len;
	space = tnt_mem_alloc(sizeof(struct tnt_schema_sval));
	if (!space)
		goto error;
	memset(space, 0, sizeof(struct tnt_schema_sval));
	if (mp_typeof(*tuple) != MP_UINT)
		goto error;
	space->number = mp_decode_uint(&tuple);
	mp_next(&tuple); /* skip owner id */
	if (mp_typeof(*tuple) != MP_STR)
		goto error;
	const char *name_tmp = mp_decode_str(&tuple, &space->name_len);
	space->name = tnt_mem_alloc(space->name_len);
	if (!space->name)
		goto error;
	memcpy(space->name, name_tmp, space->name_len);

	space->index = mh_assoc_new();
	if (!space->index)
		goto error;
	space_string = tnt_mem_alloc(sizeof(struct assoc_val));
	if (!space_string)
		goto error;
	space_string->key.id     = space->name;
	space_string->key.id_len = space->name_len;
	space_string->data = space;
	space_number = tnt_mem_alloc(sizeof(struct assoc_val));
	if (!space_number)
		goto error;
	space_number->key.id = (void *)&(space->number);
	space_number->key.id_len = sizeof(space->number);
	space_number->data = space;
	mh_assoc_put(schema, (const struct assoc_val **)&space_string,
		     NULL, NULL);
	mh_assoc_put(schema, (const struct assoc_val **)&space_number,
		     NULL, NULL);
	mp_next(data);
	return 0;
error:
	mp_next(data);
	tnt_schema_sval_free(space);
	if (space_string) tnt_mem_free(space_string);
	if (space_number) tnt_mem_free(space_number);
	return -1;
}